

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O1

void CubeInsert(Cube *p)

{
  if ((p->Prev == (cube *)0x0) && (p->Next == (cube *)0x0)) {
    if (p->ID != '\0') {
      if (s_List != (Cube *)0x0) {
        p->Next = s_List;
        s_List->Prev = p;
      }
      s_List = p;
      g_CoverInfo.nCubesInUse = g_CoverInfo.nCubesInUse + 1;
      return;
    }
    __assert_fail("p->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x33c,"void CubeInsert(Cube *)");
  }
  __assert_fail("p->Prev == NULL && p->Next == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                ,0x33b,"void CubeInsert(Cube *)");
}

Assistant:

void CubeInsert( Cube* p )
// inserts the cube into storage (puts it at the beginning of the list)
{
    assert( p->Prev == NULL && p->Next == NULL );
    assert( p->ID );

    if ( s_List == NULL )
        s_List = p;
    else
    {
        p->Next = s_List;

        s_List->Prev = p;
        s_List = p;
    }

    g_CoverInfo.nCubesInUse++;
}